

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationPrimitiveDiscardTests.cpp
# Opt level: O0

int vkt::tessellation::anon_unknown_0::intPow(int base,int exp)

{
  int iVar1;
  int sub;
  int exp_local;
  int base_local;
  
  if (exp == 0) {
    exp_local = 1;
  }
  else {
    iVar1 = intPow(base,exp / 2);
    if (exp % 2 == 0) {
      exp_local = iVar1 * iVar1;
    }
    else {
      exp_local = iVar1 * iVar1 * base;
    }
  }
  return exp_local;
}

Assistant:

int intPow (int base, int exp)
{
	DE_ASSERT(exp >= 0);
	if (exp == 0)
		return 1;
	else
	{
		const int sub = intPow(base, exp/2);
		if (exp % 2 == 0)
			return sub*sub;
		else
			return sub*sub*base;
	}
}